

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::erase
          (iterator *__return_storage_ptr__,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,iterator pos)

{
  iterator it;
  pointer this_00;
  undefined1 local_28 [8];
  iterator i;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_local;
  
  i.it_.bucket_index_ = (size_type)this;
  if ((this->arena_ == (Arena *)0x0) &&
     (this_00 = iterator::operator->(&pos), this_00 != (pointer)0x0)) {
    MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>::~MapPair(this_00);
    operator_delete(this_00,0x20);
  }
  iterator::operator++((iterator *)local_28,&pos,0);
  it.m_ = (InnerMap *)i.it_.node_;
  it.node_ = (Node *)local_28;
  it.bucket_index_ = (size_type)i.it_.m_;
  InnerMap::erase(this->elements_,it);
  (__return_storage_ptr__->it_).node_ = pos.it_.node_;
  (__return_storage_ptr__->it_).m_ = pos.it_.m_;
  (__return_storage_ptr__->it_).bucket_index_ = pos.it_.bucket_index_;
  return __return_storage_ptr__;
}

Assistant:

iterator erase(iterator pos) {
    if (arena_ == NULL) delete pos.operator->();
    iterator i = pos++;
    elements_->erase(i.it_);
    return pos;
  }